

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O0

bool __thiscall
iDynTree::ModelExporter::exportModelToString
          (ModelExporter *this,string *modelString,string *filetype)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer this_00;
  string *in_RDX;
  stringstream error_msg;
  ModelExporterOptions *in_stack_000001a8;
  string *in_stack_000001b0;
  Model *in_stack_000001b8;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  ModelExporterOptions *in_stack_fffffffffffffda0;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [407];
  byte local_1;
  
  bVar1 = std::operator!=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Filetype ");
    poVar2 = std::operator<<(poVar2,in_RDX);
    std::operator<<(poVar2," not supported. Only urdf format is currently supported.");
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("ModelExporter","exportModelToString",pcVar3);
    std::__cxx11::string::~string(local_1d8);
    local_1 = 0;
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    this_00 = std::
              unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
              ::operator->((unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
                            *)0x18b67a);
    std::
    unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
    ::operator->((unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
                  *)0x18b696);
    ModelExporterOptions::ModelExporterOptions
              (in_stack_fffffffffffffda0,
               (ModelExporterOptions *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98)
              );
    local_1 = URDFStringFromModel(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
    ModelExporterOptions::~ModelExporterOptions((ModelExporterOptions *)this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ModelExporter::exportModelToString(std::string & modelString, const std::string filetype)
{
    if (filetype != "urdf") {
        std::stringstream error_msg;
        error_msg << "Filetype " << filetype << " not supported. Only urdf format is currently supported.";
        reportError("ModelExporter", "exportModelToString", error_msg.str().c_str());
        return false;
    }

    return URDFStringFromModel(m_pimpl->m_model, modelString, m_pimpl->m_options);
}